

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  sVar3 = strlen(filename);
  if ((sVar3 < 5) ||
     (((iVar1 = strcmp(filename + (sVar3 - 4),".tec"), iVar1 != 0 &&
       (iVar1 = strcmp(filename + (sVar3 - 4),".dat"), iVar1 != 0)) &&
      (iVar1 = strcmp(filename + (sVar3 - 2),".t"), iVar1 != 0)))) {
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".avm"), iVar1 == 0)) {
      uVar2 = ref_gather_avm(ref_grid,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb6e,"ref_gather_by_extension",(ulong)uVar2,"scalar plt");
        return uVar2;
      }
      return 0;
    }
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".plt"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_by_extension(ref_grid,0,(REF_DBL *)0x0,(char **)0x0,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb74,"ref_gather_by_extension",(ulong)uVar2,"scalar plt");
        return uVar2;
      }
      return 0;
    }
    if ((10 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 10),".lb8.ugrid"), iVar1 == 0)) {
      uVar2 = ref_gather_bin_ugrid(ref_grid,filename,0,0);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb7a,"ref_gather_by_extension",(ulong)uVar2,".lb8.ugrid failed");
        return uVar2;
      }
      return 0;
    }
    if ((9 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 9),".b8.ugrid"), iVar1 == 0)) {
      uVar2 = ref_gather_bin_ugrid(ref_grid,filename,1,0);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb80,"ref_gather_by_extension",(ulong)uVar2,".b8.ugrid failed");
        return uVar2;
      }
      return 0;
    }
    if ((0xb < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 0xb),".lb8l.ugrid"), iVar1 == 0)) {
      uVar2 = ref_gather_bin_ugrid(ref_grid,filename,0,1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb86,"ref_gather_by_extension",(ulong)uVar2,".lb8l.ugrid failed");
        return uVar2;
      }
      return 0;
    }
    if ((10 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 10),".b8l.ugrid"), iVar1 == 0)) {
      uVar2 = ref_gather_bin_ugrid(ref_grid,filename,1,1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb8c,"ref_gather_by_extension",(ulong)uVar2,".b8l.ugrid failed");
        return uVar2;
      }
      return 0;
    }
    if ((0xc < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 0xc),".lb8.ugrid64"), iVar1 == 0)) {
      uVar2 = ref_gather_bin_ugrid(ref_grid,filename,0,1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb92,"ref_gather_by_extension",(ulong)uVar2,".lb8.ugrid64 failed");
        return uVar2;
      }
      return 0;
    }
    if ((0xb < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 0xb),".b8.ugrid64"), iVar1 == 0)) {
      uVar2 = ref_gather_bin_ugrid(ref_grid,filename,1,1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb98,"ref_gather_by_extension",(ulong)uVar2,".b8.ugrid64 failed");
        return uVar2;
      }
      return 0;
    }
    if ((6 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 6),".meshb"), iVar1 == 0)) {
      uVar2 = ref_gather_meshb(ref_grid,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xb9d,"ref_gather_by_extension",(ulong)uVar2,"meshb failed");
        return uVar2;
      }
      return 0;
    }
    printf("%s: %d: %s %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xba0,
           "output file name extension unknown",filename);
    ref_grid_local._4_4_ = 1;
  }
  else {
    ref_grid_local._4_4_ = ref_gather_tec(ref_grid,filename);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xb69,"ref_gather_by_extension",(ulong)ref_grid_local._4_4_,"scalar tec");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 4 && (strcmp(&filename[end_of_string - 4], ".tec") == 0 ||
                            strcmp(&filename[end_of_string - 4], ".dat") == 0 ||
                            strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_tec(ref_grid, filename), "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".avm") == 0)) {
    RSS(ref_gather_avm(ref_grid, filename), "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".plt") == 0)) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 0, NULL, NULL, filename),
        "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        ".lb8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        ".b8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_gather_meshb(ref_grid, filename), "meshb failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "output file name extension unknown", filename);
  return REF_FAILURE;
}